

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O2

bool __thiscall
UniValue::checkObject
          (UniValue *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue::VType>_>_>
          *t)

{
  bool bVar1;
  const_reference pvVar2;
  _Rb_tree_node_base *p_Var3;
  bool bVar4;
  size_t idx;
  size_t local_38;
  
  if (this->typ == VOBJ) {
    for (p_Var3 = *(_Rb_tree_node_base **)(t + 0x18);
        bVar4 = p_Var3 == (_Rb_tree_node_base *)(t + 8), !bVar4;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      local_38 = 0;
      bVar1 = findKey(this,(string *)(p_Var3 + 1),&local_38);
      if (!bVar1) goto LAB_00420955;
      pvVar2 = std::vector<UniValue,_std::allocator<UniValue>_>::at(&this->values,local_38);
      if (pvVar2->typ != p_Var3[2]._M_color) {
        return bVar4;
      }
    }
  }
  else {
LAB_00420955:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool UniValue::checkObject(const std::map<std::string,UniValue::VType>& t) const
{
    if (typ != VOBJ)
        return false;

    for (std::map<std::string,UniValue::VType>::const_iterator it = t.begin();
         it != t.end(); ++it) {
        size_t idx = 0;
        if (!findKey(it->first, idx))
            return false;

        if (values.at(idx).getType() != it->second)
            return false;
    }

    return true;
}